

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolutionNeighbourhood.cpp
# Opt level: O3

Solution * __thiscall SolutionNeighbourhood::getNext(SolutionNeighbourhood *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Turn *pTVar2;
  NurseSolution *this_00;
  pointer pcVar3;
  pointer pvVar4;
  bool bVar5;
  int iVar6;
  pointer ppNVar7;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar8;
  Move *pMVar9;
  ShiftType *pSVar10;
  string *psVar11;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar12;
  vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *pvVar13;
  Scenario *this_01;
  WeekData *this_02;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_03;
  const_iterator cVar14;
  const_iterator cVar15;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar16;
  _Base_ptr p_Var17;
  Solution *pSVar18;
  pointer ppNVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  NurseSolution *pNVar24;
  __hashtable *__h;
  long lVar25;
  Solution *unaff_R14;
  long lVar26;
  vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> tempVector;
  void *local_128;
  iterator iStack_120;
  NurseSolution **local_118;
  string local_110;
  Position local_f0;
  Position local_c0;
  Position local_90;
  Position local_60;
  
  undoLastMove(this);
  if (this->phase == 0) {
    do {
      do {
        pvVar12 = Solution::getTurns(this->solution);
        pTVar2 = *(Turn **)(*(long *)&(pvVar12->
                                      super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[this->iterator1].
                                      super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                                      super__Vector_impl_data + (long)this->iterator2 * 8);
        pvVar13 = Turn::getNurses(pTVar2);
        ppNVar7 = (pvVar13->super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        ppNVar19 = (pvVar13->super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        this_01 = Scenario::getInstance();
        this_02 = Scenario::getWeekData(this_01);
        this_03 = &WeekData::getRequirements_abi_cxx11_(this_02)->_M_h;
        psVar11 = Turn::getSkill_abi_cxx11_(pTVar2);
        cVar14 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(this_03,psVar11);
        if (cVar14.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_00115e31:
          std::__throw_out_of_range("_Map_base::at");
LAB_00115e3d:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        pSVar10 = Turn::getShiftType(pTVar2);
        psVar11 = ShiftType::getId_abi_cxx11_(pSVar10);
        cVar15 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)((long)cVar14.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
                                  ._M_cur + 0x28),psVar11);
        if (cVar15.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00115e31;
        iVar6 = Turn::getDay(pTVar2);
        if ((ulong)(*(long *)((long)cVar15.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                    ._M_cur + 0x30) -
                    *(long *)((long)cVar15.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                    ._M_cur + 0x28) >> 3) <= (ulong)(long)iVar6) goto LAB_00115e3d;
        iVar6 = DayRequirement::getOptimalCoverage
                          (*(DayRequirement **)
                            (*(long *)((long)cVar15.
                                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                             ._M_cur + 0x28) + (long)iVar6 * 8));
        pSVar18 = this->solution;
        if ((ulong)((long)ppNVar7 - (long)ppNVar19 >> 3) < (ulong)(long)iVar6) {
          local_128 = (void *)0x0;
          iStack_120._M_current = (NurseSolution **)0x0;
          local_118 = (NurseSolution **)0x0;
          pmVar16 = Solution::getNurses_abi_cxx11_(pSVar18);
          for (p_Var17 = (pmVar16->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              pmVar16 = Solution::getNurses_abi_cxx11_(this->solution),
              (_Rb_tree_header *)p_Var17 != &(pmVar16->_M_t)._M_impl.super__Rb_tree_header;
              p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
            if (iStack_120._M_current == local_118) {
              std::vector<NurseSolution*,std::allocator<NurseSolution*>>::
              _M_realloc_insert<NurseSolution*const&>
                        ((vector<NurseSolution*,std::allocator<NurseSolution*>> *)&local_128,
                         iStack_120,(NurseSolution **)(p_Var17 + 2));
            }
            else {
              *iStack_120._M_current = *(NurseSolution **)(p_Var17 + 2);
              iStack_120._M_current = iStack_120._M_current + 1;
            }
          }
          uVar21 = (ulong)this->iteratorTurn1;
          while (uVar21 < (ulong)((long)iStack_120._M_current - (long)local_128 >> 3)) {
            bVar5 = Solution::assignNurseToTurn
                              (this->solution,*(NurseSolution **)((long)local_128 + uVar21 * 8),
                               pTVar2);
            if (bVar5) {
              pMVar9 = (Move *)operator_new(0x70);
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
              Position::Position(&local_90,-1,(ShiftType *)0x0,&local_110);
              iVar6 = Turn::getDay(pTVar2);
              pSVar10 = Turn::getShiftType(pTVar2);
              psVar11 = Turn::getSkill_abi_cxx11_(pTVar2);
              Position::Position(&local_c0,iVar6,pSVar10,psVar11);
              Move::Move(pMVar9,&local_90,&local_c0,
                         *(NurseSolution **)((long)local_128 + (long)this->iteratorTurn1 * 8));
              this->lastMove = pMVar9;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0.skill._M_dataplus._M_p != &local_c0.skill.field_2) {
                operator_delete(local_c0.skill._M_dataplus._M_p,
                                local_c0.skill.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90.skill._M_dataplus._M_p != &local_90.skill.field_2) {
                operator_delete(local_90.skill._M_dataplus._M_p,
                                local_90.skill.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                local_110.field_2._M_allocated_capacity + 1);
              }
              this->iteratorTurn1 = this->iteratorTurn1 + 1;
              unaff_R14 = this->solution;
              bVar5 = true;
              goto LAB_00115d70;
            }
            uVar21 = (long)this->iteratorTurn1 + 1;
            this->iteratorTurn1 = (int)uVar21;
          }
          bVar5 = false;
LAB_00115d70:
          if (local_128 != (void *)0x0) {
            operator_delete(local_128,(long)local_118 - (long)local_128);
          }
          if (bVar5) {
            return unaff_R14;
          }
          pSVar18 = this->solution;
        }
        this->iteratorTurn1 = 0;
        lVar25 = (long)this->iterator2 + 1;
        this->iterator2 = (int)lVar25;
        pvVar12 = Solution::getTurns(pSVar18);
        lVar26 = (long)this->iterator1;
        pvVar4 = (pvVar12->
                 super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while ((long)*(pointer *)
                      ((long)&pvVar4[lVar26].super__Vector_base<Turn_*,_std::allocator<Turn_*>_>.
                              _M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar4[lVar26].super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                         super__Vector_impl_data >> 3 != lVar25);
      this->iterator2 = 0;
      this->iterator1 = (int)(lVar26 + 1);
      pvVar12 = Solution::getTurns(this->solution);
    } while (((long)(pvVar12->
                    super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar12->
                    super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
             (lVar26 + 1) != 0);
    this->phase = this->phase + 1;
    this->iterator1 = 0;
    this->iterator2 = 0;
    pSVar18 = getNext(this);
  }
  else {
    if (this->phase == 1) {
      uVar21 = (ulong)this->iterator1;
      ppNVar7 = (this->nurseVector).
                super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppNVar19 = (this->nurseVector).
                 super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (uVar21 < (ulong)((long)ppNVar19 - (long)ppNVar7 >> 3)) {
        uVar22 = (ulong)(uint)this->iterator2;
        do {
          iVar6 = (int)uVar21;
          uVar23 = (long)ppNVar19 - (long)ppNVar7 >> 3;
          if ((ulong)(long)(int)uVar22 < uVar23) {
            do {
              if (this->iterator1 != (int)uVar22) {
                uVar21 = (ulong)this->iteratorTurn1;
                pNVar24 = ppNVar7[this->iterator1];
                while (pvVar8 = NurseSolution::getTurns(pNVar24),
                      uVar21 < (ulong)((long)(pvVar8->
                                             super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pvVar8->
                                             super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                             _M_impl.super__Vector_impl_data._M_start >> 3)) {
                  uVar21 = (ulong)this->iteratorTurn2;
                  while (pvVar8 = NurseSolution::getTurns
                                            ((this->nurseVector).
                                             super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start
                                             [this->iterator2]),
                        uVar21 < (ulong)((long)(pvVar8->
                                               super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                               _M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pvVar8->
                                               super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                               _M_impl.super__Vector_impl_data._M_start >> 3)) {
                    pvVar8 = NurseSolution::getTurns
                                       ((this->nurseVector).
                                        super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[this->iterator1]);
                    pTVar2 = (pvVar8->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                             super__Vector_impl_data._M_start[this->iteratorTurn1];
                    pvVar8 = NurseSolution::getTurns
                                       ((this->nurseVector).
                                        super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[this->iterator2]);
                    if (pTVar2 != (pvVar8->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                  _M_impl.super__Vector_impl_data._M_start[this->iteratorTurn2]) {
                      ppNVar7 = (this->nurseVector).
                                super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pNVar24 = ppNVar7[this->iterator1];
                      pvVar8 = NurseSolution::getTurns(ppNVar7[this->iterator2]);
                      bVar5 = NurseSolution::hasTurn
                                        (pNVar24,(pvVar8->
                                                 super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                 )._M_impl.super__Vector_impl_data._M_start
                                                 [this->iteratorTurn2]);
                      if (!bVar5) {
                        ppNVar7 = (this->nurseVector).
                                  super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        pNVar24 = ppNVar7[this->iterator2];
                        pvVar8 = NurseSolution::getTurns(ppNVar7[this->iterator1]);
                        bVar5 = NurseSolution::hasTurn
                                          (pNVar24,(pvVar8->
                                                  super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [this->iteratorTurn1]);
                        if (!bVar5) {
                          pMVar9 = (Move *)operator_new(0x70);
                          pvVar8 = NurseSolution::getTurns
                                             ((this->nurseVector).
                                              super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [this->iterator1]);
                          iVar6 = Turn::getDay((pvVar8->
                                               super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                               _M_impl.super__Vector_impl_data._M_start
                                               [this->iteratorTurn1]);
                          pvVar8 = NurseSolution::getTurns
                                             ((this->nurseVector).
                                              super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [this->iterator1]);
                          pSVar10 = Turn::getShiftType((pvVar8->
                                                  super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [this->iteratorTurn1]);
                          pvVar8 = NurseSolution::getTurns
                                             ((this->nurseVector).
                                              super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [this->iterator1]);
                          psVar11 = Turn::getSkill_abi_cxx11_
                                              ((pvVar8->
                                               super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                               _M_impl.super__Vector_impl_data._M_start
                                               [this->iteratorTurn1]);
                          Position::Position(&local_f0,iVar6,pSVar10,psVar11);
                          pvVar8 = NurseSolution::getTurns
                                             ((this->nurseVector).
                                              super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [this->iterator2]);
                          iVar6 = Turn::getDay((pvVar8->
                                               super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                               _M_impl.super__Vector_impl_data._M_start
                                               [this->iteratorTurn2]);
                          pvVar8 = NurseSolution::getTurns
                                             ((this->nurseVector).
                                              super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [this->iterator2]);
                          pSVar10 = Turn::getShiftType((pvVar8->
                                                  super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [this->iteratorTurn2]);
                          pvVar8 = NurseSolution::getTurns
                                             ((this->nurseVector).
                                              super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [this->iterator2]);
                          psVar11 = Turn::getSkill_abi_cxx11_
                                              ((pvVar8->
                                               super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                               _M_impl.super__Vector_impl_data._M_start
                                               [this->iteratorTurn2]);
                          Position::Position(&local_60,iVar6,pSVar10,psVar11);
                          ppNVar7 = (this->nurseVector).
                                    super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          Move::Move(pMVar9,&local_f0,&local_60,ppNVar7[this->iterator1],
                                     ppNVar7[this->iterator2]);
                          this->lastMove = pMVar9;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_60.skill._M_dataplus._M_p != &local_60.skill.field_2) {
                            operator_delete(local_60.skill._M_dataplus._M_p,
                                            local_60.skill.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_f0.skill._M_dataplus._M_p != &local_f0.skill.field_2) {
                            operator_delete(local_f0.skill._M_dataplus._M_p,
                                            local_f0.skill.field_2._M_allocated_capacity + 1);
                          }
                          pSVar18 = this->solution;
                          pNVar24 = (this->nurseVector).
                                    super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[this->iterator1];
                          pvVar8 = NurseSolution::getTurns(pNVar24);
                          pTVar2 = (pvVar8->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start[this->iteratorTurn1];
                          this_00 = (this->nurseVector).
                                    super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[this->iterator2];
                          pvVar8 = NurseSolution::getTurns(this_00);
                          bVar5 = Solution::atomicSwitchNurseTurns
                                            (pSVar18,pNVar24,pTVar2,this_00,
                                             (pvVar8->
                                             super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                             _M_impl.super__Vector_impl_data._M_start
                                             [this->iteratorTurn2]);
                          if (bVar5) {
                            this->iteratorTurn2 = this->iteratorTurn2 + 1;
                            goto LAB_00115e19;
                          }
                          pMVar9 = this->lastMove;
                          if (pMVar9 != (Move *)0x0) {
                            pcVar3 = (pMVar9->lastPosition).skill._M_dataplus._M_p;
                            paVar1 = &(pMVar9->lastPosition).skill.field_2;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)pcVar3 != paVar1) {
                              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                            }
                            pcVar3 = (pMVar9->initialPosition).skill._M_dataplus._M_p;
                            paVar1 = &(pMVar9->initialPosition).skill.field_2;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)pcVar3 != paVar1) {
                              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                            }
                          }
                          operator_delete(pMVar9,0x70);
                          this->lastMove = (Move *)0x0;
                        }
                      }
                    }
                    uVar21 = (long)this->iteratorTurn2 + 1;
                    this->iteratorTurn2 = (int)uVar21;
                  }
                  uVar21 = (long)this->iteratorTurn1 + 1;
                  this->iteratorTurn1 = (int)uVar21;
                  this->iteratorTurn2 = 0;
                  pNVar24 = (this->nurseVector).
                            super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[this->iterator1];
                }
              }
              uVar22 = (long)this->iterator2 + 1;
              this->iterator2 = (int)uVar22;
              this->iteratorTurn1 = 0;
              ppNVar7 = (this->nurseVector).
                        super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              ppNVar19 = (this->nurseVector).
                         super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              uVar23 = (long)ppNVar19 - (long)ppNVar7 >> 3;
            } while (uVar22 < uVar23);
            iVar6 = this->iterator1;
          }
          this->iterator2 = 0;
          uVar20 = iVar6 + 1;
          uVar21 = (ulong)uVar20;
          this->iterator1 = uVar20;
          uVar22 = 0;
        } while ((ulong)(long)(int)uVar20 < uVar23);
      }
    }
    this->ended = true;
LAB_00115e19:
    pSVar18 = this->solution;
  }
  return pSVar18;
}

Assistant:

Solution *SolutionNeighbourhood::getNext(){
    undoLastMove();
    if(phase == 0) {
        while (1) {
            Turn *currentTurn = solution->getTurns()[iterator1][iterator2];

            if (currentTurn->getNurses().size() <
                Scenario::getInstance()->getWeekData().getRequirements().at(currentTurn->getSkill()).at(
                        currentTurn->getShiftType()->getId()).at(currentTurn->getDay())->getOptimalCoverage()) {
                vector<NurseSolution *> tempVector;
                for (auto it = solution->getNurses().begin(); it != solution->getNurses().end(); ++it) {
                    tempVector.push_back(it->second);
                }
                for (; iteratorTurn1 < tempVector.size();) {
                    if (solution->assignNurseToTurn(tempVector[iteratorTurn1], currentTurn)) {
                        lastMove = new Move(Position(-1, nullptr, ""),
                                            Position(currentTurn->getDay(), currentTurn->getShiftType(),
                                                     currentTurn->getSkill()), tempVector[iteratorTurn1]);
                        iteratorTurn1++;
                        return solution;
                    }
                    else iteratorTurn1++;
                }
            }
            iteratorTurn1 = 0;
            iterator2++;
            if (iterator2 == solution->getTurns()[iterator1].size()) {
                iterator2 = 0;
                iterator1++;
                if (iterator1 == solution->getTurns().size()) {
                    phase++;
                    iterator1 = 0;
                    iterator2 = 0;
                    return this->getNext();
                }
            }

        }
    }
    //iterate each nurse then iterate the otherNurses and check if they can trade Turns
    else if(phase == 1){
        for(;iterator1 < this->nurseVector.size();){
            for(;iterator2 < this->nurseVector.size();)
            {
                if(iterator1 != iterator2)
                    for(;iteratorTurn1 < nurseVector[iterator1]->getTurns().size();)
                    {
                        for(;iteratorTurn2 < nurseVector[iterator2]->getTurns().size();){
                            if(nurseVector[iterator1]->getTurns()[iteratorTurn1] != nurseVector[iterator2]->getTurns()[iteratorTurn2]
                                    && !nurseVector[iterator1]->hasTurn(nurseVector[iterator2]->getTurns()[iteratorTurn2]) && !nurseVector[iterator2]->hasTurn(nurseVector[iterator1]->getTurns()[iteratorTurn1])) {
                                lastMove = new Move(
                                        //initial Position
                                        Position(nurseVector[iterator1]->getTurns()[iteratorTurn1]->getDay(),
                                                 nurseVector[iterator1]->getTurns()[iteratorTurn1]->getShiftType(),
                                                 nurseVector[iterator1]->getTurns()[iteratorTurn1]->getSkill()),
                                        //lastPosition Position
                                        Position(nurseVector[iterator2]->getTurns()[iteratorTurn2]->getDay(),
                                                 nurseVector[iterator2]->getTurns()[iteratorTurn2]->getShiftType(),
                                                 nurseVector[iterator2]->getTurns()[iteratorTurn2]->getSkill()),
                                        //Ns1 / Ns2
                                        nurseVector[iterator1], nurseVector[iterator2]);

                                if(solution->atomicSwitchNurseTurns(nurseVector[iterator1],nurseVector[iterator1]->getTurns()[iteratorTurn1],nurseVector[iterator2],nurseVector[iterator2]->getTurns()[iteratorTurn2]))
                                {
                                    iteratorTurn2++;
                                    return solution;
                                    }
                                else {
                                    delete lastMove;
                                    lastMove = nullptr;
                                    iteratorTurn2++;
                                }
                            }
                            else iteratorTurn2++;
                        }
                        iteratorTurn1++;
                        iteratorTurn2 = 0;
                    }
                iterator2++;
                iteratorTurn1 = 0;
            }
            iterator2 = 0;
            iterator1++;
        }
    }
    this->ended = true;
    return solution;
}